

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_files.cpp
# Opt level: O2

void create_files(stringstream *ss)

{
  uint uVar1;
  time_t tVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  string local_78;
  int seed [10];
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    uVar1 = rand();
    seed[lVar4] = uVar1 & 10000;
  }
  for (lVar4 = 1; lVar4 != 0xb; lVar4 = lVar4 + 1) {
    poVar3 = std::operator<<((ostream *)(ss + 0x10),"..\\Files\\");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
    std::operator<<(poVar3,".txt");
    std::__cxx11::stringbuf::str();
    populateFile(&local_78,seed[lVar4]);
    std::__cxx11::string::~string((string *)&local_78);
    local_98 = local_88;
    local_90 = 0;
    local_88[0] = 0;
    std::__cxx11::stringbuf::str((string *)(ss + 0x18));
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void create_files(std::stringstream &ss) {
    srand(time(NULL));
    int seed[N];
    for (int i = 0; i < 10; ++i) {
        seed[i] = rand() & 10000;
    }
    for (int i = 1; i <= 10; i++) {
        ss << "..\\Files\\" << i << ".txt";
        populateFile(ss.str(), seed[i]);
        ss.str(std::string());
    }
}